

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O0

void ui_leave_game(game_event_type type,game_event_data *data,void *user)

{
  void *user_local;
  game_event_data *data_local;
  game_event_type type_local;
  
  event_remove_handler(EVENT_MESSAGE,display_message,(void *)0x0);
  event_remove_handler(EVENT_BELL,bell_message,(void *)0x0);
  event_remove_handler(EVENT_INPUT_FLUSH,flush,(void *)0x0);
  event_remove_handler(EVENT_MESSAGE_FLUSH,message_flush,(void *)0x0);
  return;
}

Assistant:

static void ui_leave_game(game_event_type type, game_event_data *data,
						  void *user)
{
	/* Display a message to the player */
	event_remove_handler(EVENT_MESSAGE, display_message, NULL);

	/* Display a message and make a noise to the player */
	event_remove_handler(EVENT_BELL, bell_message, NULL);

	/* Tell the UI to ignore all pending input */
	event_remove_handler(EVENT_INPUT_FLUSH, flush, NULL);

	/* Print all waiting messages */
	event_remove_handler(EVENT_MESSAGE_FLUSH, message_flush, NULL);
}